

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

void __thiscall jrtplib::RTPSession::RTPSession(RTPSession *this,RTPRandom *r,RTPMemoryManager *mgr)

{
  RTPSessionSources *this_00;
  RTPRandom *pRVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSession_00144d40;
  pRVar1 = GetRandomNumberGenerator(this,r);
  this->rtprnd = pRVar1;
  this_00 = &this->sources;
  RTPSessionSources::RTPSessionSources(this_00,this,mgr);
  RTPPacketBuilder::RTPPacketBuilder(&this->packetbuilder,this->rtprnd,mgr);
  RTCPScheduler::RTCPScheduler(&this->rtcpsched,&this_00->super_RTPSources,this->rtprnd);
  RTCPPacketBuilder::RTCPPacketBuilder
            (&this->rtcpbuilder,&this_00->super_RTPSources,&this->packetbuilder,mgr);
  RTPCollisionList::RTPCollisionList(&this->collisionlist,mgr);
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->byepackets;
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->byepackets;
  (this->byepackets).
  super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>.
  _M_impl._M_node._M_size = 0;
  this->m_changeIncomingData = false;
  this->m_changeOutgoingData = false;
  this->created = false;
  timeinit = timeinit + 1;
  return;
}

Assistant:

RTPSession::RTPSession(RTPRandom *r,RTPMemoryManager *mgr) 
	: RTPMemoryObject(mgr),rtprnd(GetRandomNumberGenerator(r)),sources(*this,mgr),packetbuilder(*rtprnd,mgr),rtcpsched(sources,*rtprnd),
	  rtcpbuilder(sources,packetbuilder,mgr),collisionlist(mgr)
{
	// We're not going to set these flags in Create, so that the constructor of a derived class
	// can already change them
	m_changeIncomingData = false;
	m_changeOutgoingData = false;

	created = false;
	timeinit.Dummy();

	//std::cout << (void *)(rtprnd) << std::endl;
}